

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::FileDescriptorTables::FileDescriptorTables(FileDescriptorTables *this)

{
  unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>
  *puVar1;
  
  (this->symbols_by_parent_)._M_h._M_buckets = &(this->symbols_by_parent_)._M_h._M_single_bucket;
  (this->symbols_by_parent_)._M_h._M_bucket_count = 1;
  (this->symbols_by_parent_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->symbols_by_parent_)._M_h._M_element_count = 0;
  (this->symbols_by_parent_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->symbols_by_parent_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->symbols_by_parent_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->fields_by_lowercase_name_)._M_h._M_buckets =
       &(this->fields_by_lowercase_name_)._M_h._M_single_bucket;
  (this->fields_by_lowercase_name_)._M_h._M_bucket_count = 1;
  (this->fields_by_lowercase_name_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->fields_by_lowercase_name_)._M_h._M_element_count = 0;
  (this->fields_by_lowercase_name_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->fields_by_lowercase_name_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->fields_by_lowercase_name_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  puVar1 = (unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>
            *)operator_new(0x38);
  (puVar1->_M_h)._M_buckets = (__buckets_ptr)0x0;
  (puVar1->_M_h)._M_bucket_count = 0;
  *(undefined8 *)&(puVar1->_M_h)._M_rehash_policy = 0;
  *(size_t *)((long)&(puVar1->_M_h)._M_rehash_policy + 8) = 0;
  (puVar1->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (puVar1->_M_h)._M_element_count = 0;
  (puVar1->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  (puVar1->_M_h)._M_buckets = &(puVar1->_M_h)._M_single_bucket;
  (puVar1->_M_h)._M_bucket_count = 1;
  (puVar1->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  *(size_t *)((long)&(puVar1->_M_h)._M_rehash_policy + 8) = 0;
  (puVar1->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  (this->fields_by_lowercase_name_tmp_)._M_t.
  super___uniq_ptr_impl<std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>,_std::default_delete<std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_*,_std::default_delete<std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_>_>
  .
  super__Head_base<0UL,_std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_*,_false>
  ._M_head_impl = puVar1;
  (this->fields_by_lowercase_name_once_)._M_once = 0;
  (this->fields_by_camelcase_name_)._M_h._M_buckets =
       &(this->fields_by_camelcase_name_)._M_h._M_single_bucket;
  (this->fields_by_camelcase_name_)._M_h._M_bucket_count = 1;
  (this->fields_by_camelcase_name_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->fields_by_camelcase_name_)._M_h._M_element_count = 0;
  (this->fields_by_camelcase_name_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->fields_by_camelcase_name_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->fields_by_camelcase_name_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  puVar1 = (unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>
            *)operator_new(0x38);
  (puVar1->_M_h)._M_buckets = (__buckets_ptr)0x0;
  (puVar1->_M_h)._M_bucket_count = 0;
  *(undefined8 *)&(puVar1->_M_h)._M_rehash_policy = 0;
  *(size_t *)((long)&(puVar1->_M_h)._M_rehash_policy + 8) = 0;
  (puVar1->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  (puVar1->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (puVar1->_M_h)._M_element_count = 0;
  (puVar1->_M_h)._M_buckets = &(puVar1->_M_h)._M_single_bucket;
  (puVar1->_M_h)._M_bucket_count = 1;
  (puVar1->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  *(size_t *)((long)&(puVar1->_M_h)._M_rehash_policy + 8) = 0;
  (puVar1->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  (this->fields_by_camelcase_name_tmp_)._M_t.
  super___uniq_ptr_impl<std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>,_std::default_delete<std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_*,_std::default_delete<std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_>_>
  .
  super__Head_base<0UL,_std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_*,_false>
  ._M_head_impl = puVar1;
  (this->fields_by_camelcase_name_once_)._M_once = 0;
  (this->fields_by_number_)._M_h._M_buckets = &(this->fields_by_number_)._M_h._M_single_bucket;
  (this->fields_by_number_)._M_h._M_bucket_count = 1;
  (this->fields_by_number_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->fields_by_number_)._M_h._M_element_count = 0;
  (this->fields_by_number_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->fields_by_number_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->fields_by_number_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->enum_values_by_number_)._M_h._M_buckets =
       &(this->enum_values_by_number_)._M_h._M_single_bucket;
  (this->enum_values_by_number_)._M_h._M_bucket_count = 1;
  (this->enum_values_by_number_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->enum_values_by_number_)._M_h._M_element_count = 0;
  (this->enum_values_by_number_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->enum_values_by_number_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->enum_values_by_number_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->unknown_enum_values_by_number_)._M_h._M_buckets =
       &(this->unknown_enum_values_by_number_)._M_h._M_single_bucket;
  (this->unknown_enum_values_by_number_)._M_h._M_bucket_count = 1;
  (this->unknown_enum_values_by_number_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->unknown_enum_values_by_number_)._M_h._M_element_count = 0;
  (this->unknown_enum_values_by_number_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->unknown_enum_values_by_number_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->unknown_enum_values_by_number_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->locations_by_path_once_)._M_once = 0;
  (this->locations_by_path_)._M_h._M_buckets = &(this->locations_by_path_)._M_h._M_single_bucket;
  (this->locations_by_path_)._M_h._M_bucket_count = 1;
  (this->locations_by_path_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->locations_by_path_)._M_h._M_element_count = 0;
  (this->locations_by_path_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->unknown_enum_values_mu_).mu_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->unknown_enum_values_mu_).mu_.super___mutex_base._M_mutex + 0x10) = 0
  ;
  (this->unknown_enum_values_mu_).mu_.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->unknown_enum_values_mu_).mu_.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->unknown_enum_values_mu_).mu_.super___mutex_base._M_mutex + 8) = 0;
  (this->locations_by_path_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->locations_by_path_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

FileDescriptorTables::FileDescriptorTables()
    : fields_by_lowercase_name_tmp_(new FieldsByNameMap()),
      fields_by_camelcase_name_tmp_(new FieldsByNameMap()) {}